

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O0

void __thiscall
indk::Neuron::Entry::doAddSynapse(Entry *this,Position *SPos,uint Xm,float k1,int64_t Tl,int NT)

{
  float _k1;
  Position *_SPos;
  Synapse *this_00;
  float _Lambda;
  Synapse *local_38;
  Synapse *S;
  int64_t iStack_28;
  int NT_local;
  int64_t Tl_local;
  float k1_local;
  uint Xm_local;
  Position *SPos_local;
  Entry *this_local;
  
  S._4_4_ = NT;
  iStack_28 = Tl;
  Tl_local._0_4_ = k1;
  Tl_local._4_4_ = Xm;
  _k1_local = SPos;
  SPos_local = (Position *)this;
  this_00 = (Synapse *)operator_new(0x60);
  _SPos = _k1_local;
  _k1 = (float)Tl_local;
  _Lambda = Computer::getLambdaValue(Tl_local._4_4_);
  Synapse::Synapse(this_00,_SPos,_k1,_Lambda,iStack_28,S._4_4_);
  local_38 = this_00;
  std::vector<indk::Neuron::Synapse_*,_std::allocator<indk::Neuron::Synapse_*>_>::push_back
            (&this->Synapses,&local_38);
  return;
}

Assistant:

void indk::Neuron::Entry::doAddSynapse(indk::Position *SPos, unsigned int Xm, float k1, int64_t Tl, int NT) {
	auto *S = new Synapse(SPos, k1, indk::Computer::getLambdaValue(Xm), Tl, NT);
    Synapses.push_back(S);
}